

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QName.cpp
# Opt level: O0

void __thiscall xercesc_4_0::QName::setNPrefix(QName *this,XMLCh *prefix,XMLSize_t newLen)

{
  int iVar1;
  undefined4 extraout_var;
  XMLSize_t newLen_local;
  XMLCh *prefix_local;
  QName *this_local;
  
  if ((this->fPrefixBufSz == 0) || (this->fPrefixBufSz < newLen)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPrefix);
    this->fPrefix = (XMLCh *)0x0;
    this->fPrefixBufSz = newLen + 8;
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(this->fPrefixBufSz + 1) * 2);
    this->fPrefix = (XMLCh *)CONCAT44(extraout_var,iVar1);
  }
  XMLString::moveChars(this->fPrefix,prefix,newLen);
  this->fPrefix[newLen] = L'\0';
  return;
}

Assistant:

void QName::setNPrefix(const XMLCh* prefix, const XMLSize_t newLen)
{
    if (!fPrefixBufSz || (newLen > fPrefixBufSz))
    {
        fMemoryManager->deallocate(fPrefix); //delete [] fPrefix;
        fPrefix = 0;
        fPrefixBufSz = newLen + 8;
        fPrefix = (XMLCh*) fMemoryManager->allocate
        (
            (fPrefixBufSz + 1) * sizeof(XMLCh)
        ); //new XMLCh[fPrefixBufSz + 1];
    }
    XMLString::moveChars(fPrefix, prefix, newLen);
    fPrefix[newLen] = chNull;
}